

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructDeserializer.hpp
# Opt level: O1

void mserialize::
     StructDeserializer<binlog::ClockSync,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockValue>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockFrequency>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::nsSinceEpoch>,_std::integral_constant<int_binlog::ClockSync::*,_&binlog::ClockSync::tzOffset>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::ClockSync::*,_&binlog::ClockSync::tzName>_>
     ::deserialize<binlog::Range>(ClockSync *t,Range *istream)

{
  binlog::Range::throw_if_overflow(istream,8);
  t->clockValue = *(uint64_t *)istream->_begin;
  istream->_begin = istream->_begin + 8;
  binlog::Range::throw_if_overflow(istream,8);
  t->clockFrequency = *(uint64_t *)istream->_begin;
  istream->_begin = istream->_begin + 8;
  binlog::Range::throw_if_overflow(istream,8);
  t->nsSinceEpoch = *(uint64_t *)istream->_begin;
  istream->_begin = istream->_begin + 8;
  binlog::Range::throw_if_overflow(istream,4);
  t->tzOffset = *(int32_t *)istream->_begin;
  istream->_begin = istream->_begin + 4;
  detail::
  BuiltinDeserializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::deserialize<binlog::Range>(&t->tzName,istream);
  return;
}

Assistant:

static void deserialize(T& t, InputStream& istream)
  {
    using swallow = int[];
    (void)swallow{1, (deserialize_member(t, Members::value, istream), int{})...};
  }